

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Simplex_tree.h
# Opt level: O0

void __thiscall
Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_custom_fil_values_default>::initialize_filtration
          (Simplex_tree<Gudhi::Simplex_tree_options_custom_fil_values_default> *this,
          bool ignore_infinite_values)

{
  anon_class_1_0_00000001 local_31;
  is_before_in_totally_ordered_filtration local_30;
  anon_class_1_0_00000001 local_21;
  is_before_in_totally_ordered_filtration local_20;
  undefined1 local_11;
  Simplex_tree<Gudhi::Simplex_tree_options_custom_fil_values_default> *pSStack_10;
  bool ignore_infinite_values_local;
  Simplex_tree<Gudhi::Simplex_tree_options_custom_fil_values_default> *this_local;
  
  local_11 = ignore_infinite_values;
  pSStack_10 = this;
  if (ignore_infinite_values) {
    is_before_in_totally_ordered_filtration::is_before_in_totally_ordered_filtration(&local_20,this)
    ;
    initialize_filtration<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_custom_fil_values_default>::is_before_in_totally_ordered_filtration,Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_custom_fil_values_default>::initialize_filtration(bool)const::_lambda(boost::container::vec_iterator<std::pair<short,Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_custom_fil_values_default>>>*,true>)_1_>
              (this,&local_20,&local_21);
  }
  else {
    is_before_in_totally_ordered_filtration::is_before_in_totally_ordered_filtration(&local_30,this)
    ;
    initialize_filtration<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_custom_fil_values_default>::is_before_in_totally_ordered_filtration,Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_custom_fil_values_default>::initialize_filtration(bool)const::_lambda(boost::container::vec_iterator<std::pair<short,Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_custom_fil_values_default>>>*,true>)_2_>
              (this,&local_30,&local_31);
  }
  return;
}

Assistant:

void initialize_filtration(bool ignore_infinite_values = false) const {
    if (ignore_infinite_values){
      initialize_filtration(is_before_in_totally_ordered_filtration(this), [&](Simplex_handle sh) -> bool {
        return filtration(sh) == Filtration_simplex_base_real::get_infinity();
      });
    } else {
      initialize_filtration(is_before_in_totally_ordered_filtration(this), [](Simplex_handle) -> bool {
        return false;
      });
    }
  }